

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP.h
# Opt level: O1

void __thiscall ASDCP::TimedText::FrameBuffer::~FrameBuffer(FrameBuffer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)this = &PTR__FrameBuffer_0011abe0;
  pcVar2 = (this->m_MIMEType)._M_dataplus._M_p;
  paVar1 = &(this->m_MIMEType).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  ASDCP::FrameBuffer::~FrameBuffer(&this->super_FrameBuffer);
  return;
}

Assistant:

virtual ~FrameBuffer() {}